

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void checkfor_storagefull(uint npages)

{
  uint uVar1;
  LispPTR *pLVar2;
  INTSTAT *int_state;
  int pagesleft;
  uint npages_local;
  
  uVar1 = (*Next_MDSpage_word - *Next_Array_word) - 2;
  if (((int)uVar1 < 0x80) || (npages != 0)) {
    if (*STORAGEFULLSTATE_word == 0) {
      set_storage_state();
    }
    switch((short)*STORAGEFULLSTATE_word) {
    case 1:
    case 4:
      if ((int)uVar1 < 0) {
        do {
          error("MP9320:Storage completely full");
        } while( true );
      }
      if (((int)uVar1 < 0x41) && (*STORAGEFULL_word != 0)) {
        *STORAGEFULL_word = 0xe0000;
        error("MP9325:Space getting VERY full.\t\tPlease save and reload a.s.a.p.");
      }
      else if (*STORAGEFULL_word == 0) {
        *STORAGEFULL_word = 0x4c;
        pLVar2 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
        *(ushort *)((long)pLVar2 + 2) = *(ushort *)((long)pLVar2 + 2) & 0xfdff | 0x200;
        *PENDINGINTERRUPT_word = 0x4c;
      }
      break;
    case 2:
      if (npages == 0) {
        if ((int)uVar1 < 1) {
          *LeastMDSPage_word = *Next_Array_word;
          *Next_MDSpage_word = *SecondMDSPage_word;
          advance_storagestate(4);
          advance_array_seg(*SecondArrayPage_word);
        }
      }
      else if (uVar1 < npages) {
        *LeastMDSPage_word = *Next_Array_word;
        advance_storagestate(3);
        advance_array_seg(*SecondArrayPage_word);
      }
      break;
    case 3:
      if (*Next_MDSpage_word < *LeastMDSPage_word) {
        *Next_MDSpage_word = *SecondMDSPage_word;
        advance_storagestate(4);
      }
      break;
    default:
      error("checkfor_storagefull: Shouldn\'t");
    }
  }
  return;
}

Assistant:

void checkfor_storagefull(unsigned int npages) {
  int pagesleft;
  INTSTAT *int_state;

#ifdef BIGVM
  pagesleft = (*Next_MDSpage_word) - (*Next_Array_word) - PAGESPER_MDSUNIT;
#else
  pagesleft = (*Next_MDSpage_word & 0xffff) - (*Next_Array_word & 0xffff) - PAGESPER_MDSUNIT;
#endif

  if ((pagesleft < GUARDSTORAGEFULL) || (npages != 0)) {
    if (*STORAGEFULLSTATE_word == NIL) set_storage_state();

    switch (*STORAGEFULLSTATE_word & 0xffff) {
      case SFS_NOTSWITCHABLE:
      case SFS_FULLYSWITCHED:
        if (pagesleft < 0) {
          while (T) { error("MP9320:Storage completely full"); }
        } else if ((pagesleft <= GUARD1STORAGEFULL) && (*STORAGEFULL_word != NIL)) {
          *STORAGEFULL_word = S_POSITIVE;
          error(
              "MP9325:Space getting VERY full.\
		Please save and reload a.s.a.p.");
        } else if (*STORAGEFULL_word == NIL) {
          *STORAGEFULL_word = ATOM_T;
          int_state = (INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
          int_state->storagefull = T;
          *PENDINGINTERRUPT_word = ATOM_T;
        }
#ifdef DEBUG
        printf("\n checkfor_storagefull:DORECLAIM.....\n");
#endif
        return; /*(NIL); */

      case SFS_SWITCHABLE:
        if (npages == NIL) {
          if (pagesleft <= 0) {
            *LeastMDSPage_word = *Next_Array_word;
            *Next_MDSpage_word = *SecondMDSPage_word;
            advance_storagestate(SFS_FULLYSWITCHED);
            advance_array_seg(*SecondArrayPage_word);
            return;
          }
        } else if (npages > pagesleft) {
          /* Have to switch array space over,
            but leave MDS to fill the rest of the low pages   */
          *LeastMDSPage_word = *Next_Array_word;
          advance_storagestate(SFS_ARRAYSWITCHED);
          advance_array_seg(*SecondArrayPage_word);
          return;
        }
        break;
#ifdef BIGVM
      case SFS_ARRAYSWITCHED:
        if ((*Next_MDSpage_word) < (*LeastMDSPage_word))
#else
      case SFS_ARRAYSWITCHED:
        if ((*Next_MDSpage_word & 0xffff) < (*LeastMDSPage_word & 0xffff))
#endif
        {
          *Next_MDSpage_word = *SecondMDSPage_word;
          advance_storagestate(SFS_FULLYSWITCHED);
          return;
        } else if (npages != NIL)
          if ((npages + GUARDSTORAGEFULL) >=
#ifdef BIGVM
              ((*SecondMDSPage_word) - (*Next_Array_word)))
#else
              ((*SecondMDSPage_word & 0xffff) - (*Next_Array_word & 0xffff)))
#endif
            return; /*  (NIL); */
        return;     /* (T); */
      /* break; */

      default:
        error("checkfor_storagefull: Shouldn't"); /* (*STORAGEFULLSTATE_word) & 0xffff) */
        break;
    }
  } else
    return; /*(NIL); */
}